

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended.hpp
# Opt level: O0

void shrink_to_fit_hplane(IsoHPlane *hplane,bool clear_vectors)

{
  byte in_SIL;
  
  if ((in_SIL & 1) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a9bf3);
    std::vector<ColType,_std::allocator<ColType>_>::clear
              ((vector<ColType,_std::allocator<ColType>_> *)0x1a9c01);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x1a9c0f);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x1a9c1d);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)0x1a9c2b);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1a9c39);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x1a9c4a);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x1a9c5b);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a9c65);
  std::vector<ColType,_std::allocator<ColType>_>::shrink_to_fit
            ((vector<ColType,_std::allocator<ColType>_> *)0x1a9c73);
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x1a9c81);
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x1a9c8f);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::shrink_to_fit((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)0x1a9c9d);
  std::vector<int,_std::allocator<int>_>::shrink_to_fit
            ((vector<int,_std::allocator<int>_> *)0x1a9cab);
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x1a9cbc);
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x1a9ccd);
  return;
}

Assistant:

void shrink_to_fit_hplane(IsoHPlane &hplane, bool clear_vectors)
{
    if (clear_vectors)
    {
        hplane.col_num.clear();
        hplane.col_type.clear();
        hplane.coef.clear();
        hplane.mean.clear();
        hplane.cat_coef.clear();
        hplane.chosen_cat.clear();
        hplane.fill_val.clear();
        hplane.fill_new.clear();
    }

    hplane.col_num.shrink_to_fit();
    hplane.col_type.shrink_to_fit();
    hplane.coef.shrink_to_fit();
    hplane.mean.shrink_to_fit();
    hplane.cat_coef.shrink_to_fit();
    hplane.chosen_cat.shrink_to_fit();
    hplane.fill_val.shrink_to_fit();
    hplane.fill_new.shrink_to_fit();
}